

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribute.c
# Opt level: O0

int distribute_set_out(uint32_t field,uint32_t location,void *buffer,mixed_segment *segment)

{
  vector *vector;
  distribute_data *data;
  mixed_segment *segment_local;
  void *buffer_local;
  uint32_t location_local;
  uint32_t field_local;
  
  vector = (vector *)segment->data;
  if (field == 0) {
    if (buffer == (void *)0x0) {
      if (location < vector->count) {
        mixed_free_buffer((mixed_buffer *)vector->data[location]);
        location_local = vector_remove_pos(location,vector);
      }
      else {
        mixed_err(6);
        location_local = 0;
      }
    }
    else if (*buffer == 0) {
      *(undefined1 *)((long)buffer + 0x18) = 1;
      if (location < vector->count) {
        vector->data[location] = buffer;
        location_local = 1;
      }
      else {
        location_local = vector_add(buffer,vector);
      }
    }
    else {
      mixed_err(0x15);
      location_local = 0;
    }
  }
  else {
    mixed_err(7);
    location_local = 0;
  }
  return location_local;
}

Assistant:

int distribute_set_out(uint32_t field, uint32_t location, void *buffer, struct mixed_segment *segment){
  struct distribute_data *data = (struct distribute_data *)segment->data;

  switch(field){
  case MIXED_BUFFER:
    if(buffer){ // Add or set an element
      if(((struct mixed_buffer *)buffer)->_data){
        mixed_err(MIXED_BUFFER_ALLOCATED);
        return 0;
      }
      ((struct mixed_buffer *)buffer)->is_virtual = 1;
      if(location < data->count){
        data->out[location] = (struct mixed_buffer *)buffer;
      }else{
        return vector_add(buffer, (struct vector *)data);
      }
    }else{ // Remove an element
      if(data->count <= location){
        mixed_err(MIXED_INVALID_LOCATION);
        return 0;
      }
      mixed_free_buffer(data->out[location]);
      return vector_remove_pos(location, (struct vector *)data);
    }
    return 1;
  default:
    mixed_err(MIXED_INVALID_FIELD);
    return 0;
  }
}